

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int rebuild_ch_inner(ptls_buffer_t *buf,uint8_t *src,uint8_t *end,st_ptls_client_hello_t *outer_ch,
                    uint8_t *outer_ext,uint8_t *outer_ext_end)

{
  uint8_t *puVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint8_t *puVar10;
  size_t sVar11;
  byte *pbVar12;
  int iVar13;
  bool bVar14;
  byte *local_50;
  uint8_t *local_48;
  size_t local_40;
  uint8_t *local_38;
  
  local_50 = src;
  iVar6 = ptls_buffer_reserve_aligned(buf,1,'\0');
  if (iVar6 == 0) {
    buf->base[buf->off] = '\x01';
    buf->off = buf->off + 1;
    iVar6 = 0;
  }
  if (iVar6 != 0) {
    bVar14 = false;
    goto LAB_0011bde5;
  }
  local_38 = outer_ext;
  iVar6 = ptls_buffer_reserve_aligned(buf,3,'\0');
  if (iVar6 == 0) {
    puVar10 = buf->base;
    sVar11 = buf->off;
    puVar10[sVar11 + 2] = '\0';
    puVar10 = puVar10 + sVar11;
    puVar10[0] = '\0';
    puVar10[1] = '\0';
    buf->off = buf->off + 3;
    iVar6 = 0;
  }
  iVar13 = 6;
  if (iVar6 == 0) {
    if ((long)end - (long)src < 2) {
      iVar6 = 0x32;
      puVar10 = outer_ext_end;
    }
    else {
      local_50 = src + 2;
      iVar6 = 0;
      puVar10 = (uint8_t *)(ulong)(ushort)(*(ushort *)src << 8 | *(ushort *)src >> 8);
    }
    local_40 = buf->off;
    iVar13 = 6;
    local_48 = outer_ext_end;
    if (1 < (long)end - (long)src) {
      iVar6 = ptls_buffer_reserve_aligned(buf,2,'\0');
      if (iVar6 == 0) {
        *(ushort *)(buf->base + buf->off) = (ushort)puVar10 << 8 | (ushort)puVar10 >> 8;
        buf->off = buf->off + 2;
        iVar6 = 0;
      }
      iVar13 = 6;
      if (iVar6 == 0) {
        iVar13 = 0;
      }
    }
    puVar10 = local_48;
    pbVar12 = local_50;
    if (iVar13 == 0) {
      iVar6 = 0x32;
      iVar13 = 6;
      if (0x1f < (long)end - (long)local_50) {
        iVar6 = ptls_buffer_reserve_aligned(buf,0x20,'\0');
        if (iVar6 == 0) {
          uVar3 = *(undefined8 *)(pbVar12 + 8);
          uVar4 = *(undefined8 *)(pbVar12 + 0x10);
          uVar5 = *(undefined8 *)(pbVar12 + 0x18);
          puVar1 = buf->base + buf->off;
          *(undefined8 *)puVar1 = *(undefined8 *)pbVar12;
          *(undefined8 *)(puVar1 + 8) = uVar3;
          *(undefined8 *)(puVar1 + 0x10) = uVar4;
          *(undefined8 *)(puVar1 + 0x18) = uVar5;
          buf->off = buf->off + 0x20;
          iVar6 = 0;
        }
        if (iVar6 == 0) {
          local_50 = pbVar12 + 0x20;
          iVar13 = 6;
          iVar6 = 0x32;
          if (local_50 != end) {
            local_50 = pbVar12 + 0x21;
            bVar2 = pbVar12[0x20];
            if ((ulong)bVar2 <= (ulong)((long)end - (long)local_50)) {
              iVar13 = 6;
              if (bVar2 == 0) {
                iVar13 = 0;
              }
              iVar6 = 0x2f;
              if (bVar2 == 0) {
                iVar6 = 0;
              }
            }
          }
          if (iVar13 == 0) {
            iVar6 = ptls_buffer_reserve_aligned(buf,1,'\0');
            if (iVar6 == 0) {
              buf->base[buf->off] = '\0';
              buf->off = buf->off + 1;
              iVar6 = 0;
            }
            iVar13 = 6;
            if (iVar6 == 0) {
              sVar11 = buf->off;
              iVar6 = ptls_buffer__do_pushv
                                (buf,(outer_ch->legacy_session_id).base,
                                 (outer_ch->legacy_session_id).len);
              puVar10 = local_48;
              if (iVar6 == 0) {
                uVar9 = buf->off - sVar11;
                iVar6 = 0;
                if (uVar9 < 0x100) {
                  buf->base[sVar11 - 1] = (uint8_t)uVar9;
                  bVar14 = true;
                  iVar13 = 0;
                  goto LAB_0011bbd4;
                }
                iVar6 = 0x20c;
              }
              bVar14 = false;
            }
            else {
              bVar14 = false;
              iVar13 = 6;
            }
LAB_0011bbd4:
            if (bVar14) {
              iVar6 = 0x32;
              iVar13 = 6;
              if (1 < (ulong)((long)end - (long)local_50)) {
                lVar7 = 0;
                uVar9 = 0;
                do {
                  uVar9 = (ulong)local_50[lVar7] | uVar9 << 8;
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 2);
                pbVar12 = local_50 + 2;
                local_50 = pbVar12;
                if (uVar9 <= (ulong)((long)end - (long)pbVar12)) {
                  iVar6 = ptls_buffer_reserve_aligned(buf,2,'\0');
                  if (iVar6 == 0) {
                    puVar1 = buf->base;
                    sVar11 = buf->off;
                    (puVar1 + sVar11)[0] = '\0';
                    (puVar1 + sVar11)[1] = '\0';
                    buf->off = buf->off + 2;
                    iVar6 = 0;
                  }
                  iVar13 = 6;
                  if (iVar6 == 0) {
                    sVar11 = buf->off;
                    iVar6 = ptls_buffer__do_pushv(buf,pbVar12,uVar9);
                    puVar10 = local_48;
                    if (iVar6 == 0) {
                      uVar8 = buf->off - sVar11;
                      if (uVar8 < 0x10000) {
                        lVar7 = 8;
                        do {
                          buf->base[sVar11 - 2] = (uint8_t)(uVar8 >> ((byte)lVar7 & 0x3f));
                          lVar7 = lVar7 + -8;
                          sVar11 = sVar11 + 1;
                        } while (lVar7 != -8);
                        iVar13 = 0;
                        bVar14 = true;
                        iVar6 = 0;
                        goto LAB_0011bcaf;
                      }
                      iVar6 = 0x20c;
                    }
                    bVar14 = false;
                  }
                  else {
                    bVar14 = false;
                    iVar13 = 6;
                  }
LAB_0011bcaf:
                  if (bVar14) {
                    local_50 = pbVar12 + uVar9;
                    iVar13 = 0;
                  }
                }
              }
              if (iVar13 == 0) {
                iVar6 = 0x32;
                iVar13 = 6;
                if (local_50 != end) {
                  pbVar12 = local_50 + 1;
                  uVar9 = (ulong)*local_50;
                  local_50 = pbVar12;
                  if (uVar9 <= (ulong)((long)end - (long)pbVar12)) {
                    iVar6 = ptls_buffer_reserve_aligned(buf,1,'\0');
                    if (iVar6 == 0) {
                      buf->base[buf->off] = '\0';
                      buf->off = buf->off + 1;
                      iVar6 = 0;
                    }
                    iVar13 = 6;
                    if (iVar6 == 0) {
                      sVar11 = buf->off;
                      iVar6 = ptls_buffer__do_pushv(buf,pbVar12,uVar9);
                      puVar10 = local_48;
                      if (iVar6 == 0) {
                        uVar8 = buf->off - sVar11;
                        iVar6 = 0;
                        if (uVar8 < 0x100) {
                          buf->base[sVar11 - 1] = (uint8_t)uVar8;
                          bVar14 = true;
                          iVar13 = 0;
                          goto LAB_0011bd61;
                        }
                        iVar6 = 0x20c;
                      }
                      bVar14 = false;
                    }
                    else {
                      bVar14 = false;
                      iVar13 = 6;
                    }
LAB_0011bd61:
                    if (bVar14) {
                      local_50 = pbVar12 + uVar9;
                      iVar13 = 0;
                    }
                  }
                }
                if (iVar13 == 0) {
                  iVar6 = rebuild_ch_inner_extensions(buf,&local_50,end,local_38,puVar10);
                  iVar13 = 6;
                  if (iVar6 == 0) {
                    uVar9 = buf->off - local_40;
                    iVar6 = 0x20c;
                    if (uVar9 < 0x1000000) {
                      lVar7 = 0x10;
                      iVar13 = 0;
                      do {
                        buf->base[local_40 - 3] = (uint8_t)(uVar9 >> ((byte)lVar7 & 0x3f));
                        lVar7 = lVar7 + -8;
                        local_40 = local_40 + 1;
                        iVar6 = 0;
                      } while (lVar7 != -8);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bVar14 = iVar13 == 0;
LAB_0011bde5:
  if (bVar14) {
    for (; local_50 != end; local_50 = local_50 + 1) {
      if (*local_50 != 0) {
        return 0x2f;
      }
    }
  }
  return iVar6;
}

Assistant:

static int rebuild_ch_inner(ptls_buffer_t *buf, const uint8_t *src, const uint8_t *const end,
                            struct st_ptls_client_hello_t *outer_ch, const uint8_t *outer_ext, const uint8_t *outer_ext_end)
{
#define COPY_BLOCK(capacity)                                                                                                       \
    do {                                                                                                                           \
        ptls_decode_open_block(src, end, (capacity), {                                                                             \
            ptls_buffer_push_block(buf, (capacity), { ptls_buffer_pushv(buf, src, end - src); });                                  \
            src = end;                                                                                                             \
        });                                                                                                                        \
    } while (0)

    int ret;

    ptls_buffer_push_message_body(buf, NULL, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, {
        { /* legacy_version */
            uint16_t legacy_version;
            if ((ret = ptls_decode16(&legacy_version, &src, end)) != 0)
                goto Exit;
            ptls_buffer_push16(buf, legacy_version);
        }

        /* hello random */
        if (end - src < PTLS_HELLO_RANDOM_SIZE) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        ptls_buffer_pushv(buf, src, PTLS_HELLO_RANDOM_SIZE);
        src += PTLS_HELLO_RANDOM_SIZE;

        ptls_decode_open_block(src, end, 1, {
            if (src != end) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
        });
        ptls_buffer_push_block(buf, 1,
                               { ptls_buffer_pushv(buf, outer_ch->legacy_session_id.base, outer_ch->legacy_session_id.len); });

        /* cipher-suites and legacy-compression-methods */
        COPY_BLOCK(2);
        COPY_BLOCK(1);

        /* extensions */
        if ((ret = rebuild_ch_inner_extensions(buf, &src, end, outer_ext, outer_ext_end)) != 0)
            goto Exit;
    });

    /* padding must be all zero */
    for (; src != end; ++src) {
        if (*src != '\0') {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    }

Exit:
    return ret;

#undef COPY_BLOCK
}